

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# docio.cc
# Opt level: O0

fdb_status docio_init(docio_handle *handle,filemgr *file,bool compress_document_body)

{
  int iVar1;
  byte in_DL;
  long in_RSI;
  long *in_RDI;
  fdb_status local_4;
  
  *in_RDI = in_RSI;
  in_RDI[1] = -1;
  *(undefined4 *)(in_RDI + 2) = 0;
  *(undefined2 *)((long)in_RDI + 0x14) = 0;
  in_RDI[3] = -1;
  in_RDI[4] = 0;
  *(byte *)(in_RDI + 7) = in_DL & 1;
  iVar1 = posix_memalign((void **)(in_RDI + 5),0x200,(ulong)*(uint *)(in_RSI + 0x10));
  if (iVar1 != 0) {
    in_RDI[5] = 0;
  }
  if (in_RDI[5] == 0) {
    fdb_log_impl((err_log_callback *)0x0,2,FDB_RESULT_ALLOC_FAIL,
                 "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/src/docio.cc"
                 ,"docio_init",0x30,"(docio_init) malloc_align failed: database file \'%s\'\n",
                 *(undefined8 *)*in_RDI);
    local_4 = FDB_RESULT_ALLOC_FAIL;
  }
  else {
    local_4 = FDB_RESULT_SUCCESS;
  }
  return local_4;
}

Assistant:

fdb_status docio_init(struct docio_handle *handle,
                      struct filemgr *file,
                      bool compress_document_body)
{
    handle->file = file;
    handle->curblock = BLK_NOT_FOUND;
    handle->curpos = 0;
    handle->cur_bmp_revnum_hash = 0;
    handle->lastbid = BLK_NOT_FOUND;
    handle->lastBmpRevnum = 0;
    handle->compress_document_body = compress_document_body;
    malloc_align(handle->readbuffer, FDB_SECTOR_SIZE, file->blocksize);
    if (!handle->readbuffer) {
        fdb_log(NULL, FDB_LOG_ERROR, FDB_RESULT_ALLOC_FAIL,
                "(docio_init) malloc_align failed: "
                "database file '%s'\n",
                handle->file->filename);
        return FDB_RESULT_ALLOC_FAIL;
    }
    return FDB_RESULT_SUCCESS;
}